

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O2

vector<NodeView,_std::allocator<NodeView>_> * __thiscall
NodeView::parallels(vector<NodeView,_std::allocator<NodeView>_> *__return_storage_ptr__,
                   NodeView *this)

{
  SequenceDistanceGraph *pSVar1;
  long *plVar2;
  pointer pLVar3;
  bool bVar4;
  pointer pLVar5;
  LinkView *plv;
  long *plVar6;
  DistanceGraph *pDVar7;
  set<long,_std::less<long>,_std::allocator<long>_> opnodes;
  set<long,_std::less<long>,_std::allocator<long>_> onnodes;
  vector<LinkView,_std::allocator<LinkView>_> n;
  vector<LinkView,_std::allocator<LinkView>_> p;
  set<long,_std::less<long>,_std::allocator<long>_> nnodes;
  set<long,_std::less<long>,_std::allocator<long>_> pnodes;
  _Vector_base<LinkView,_std::allocator<LinkView>_> local_168;
  long *local_150;
  undefined1 local_148 [16];
  _Base_ptr local_138;
  _Base_ptr local_130;
  size_t local_128;
  NodeView local_120;
  undefined1 local_110 [8];
  _Rb_tree_node_base _Stack_108;
  size_t local_e8;
  pointer local_e0;
  _Vector_base<LinkView,_std::allocator<LinkView>_> local_d8;
  _Vector_base<LinkView,_std::allocator<LinkView>_> local_c0;
  _Vector_base<LinkView,_std::allocator<LinkView>_> local_a8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_90;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  prev((vector<LinkView,_std::allocator<LinkView>_> *)&local_a8,this);
  next((vector<LinkView,_std::allocator<LinkView>_> *)&local_c0,this);
  if ((local_a8._M_impl.super__Vector_impl_data._M_start ==
       local_a8._M_impl.super__Vector_impl_data._M_finish) ||
     (local_c0._M_impl.super__Vector_impl_data._M_start ==
      local_c0._M_impl.super__Vector_impl_data._M_finish)) {
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NodeView,_std::allocator<NodeView>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    prev((vector<LinkView,_std::allocator<LinkView>_> *)&local_150,this);
    plVar2 = (long *)CONCAT44(local_148._4_4_,local_148._0_4_);
    for (plVar6 = local_150; plVar6 != plVar2; plVar6 = plVar6 + 5) {
      local_110 = (undefined1  [8])*plVar6;
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_insert_unique<long>(&local_60,(long *)local_110);
    }
    std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base
              ((_Vector_base<LinkView,_std::allocator<LinkView>_> *)&local_150);
    next((vector<LinkView,_std::allocator<LinkView>_> *)&local_150,this);
    plVar2 = (long *)CONCAT44(local_148._4_4_,local_148._0_4_);
    for (plVar6 = local_150; plVar6 != plVar2; plVar6 = plVar6 + 5) {
      local_110 = (undefined1  [8])*plVar6;
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      _M_insert_unique<long>(&local_90,(long *)local_110);
    }
    std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base
              ((_Vector_base<LinkView,_std::allocator<LinkView>_> *)&local_150);
    prev((vector<LinkView,_std::allocator<LinkView>_> *)&local_150,this);
    local_110 = (undefined1  [8])*local_150;
    _Stack_108._0_8_ = local_150[1];
    next((vector<LinkView,_std::allocator<LinkView>_> *)&local_d8,(NodeView *)local_110);
    std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base
              ((_Vector_base<LinkView,_std::allocator<LinkView>_> *)&local_150);
    local_e0 = local_d8._M_impl.super__Vector_impl_data._M_finish;
    for (pLVar5 = local_d8._M_impl.super__Vector_impl_data._M_start;
        pLVar5 != local_d8._M_impl.super__Vector_impl_data._M_finish; pLVar5 = pLVar5 + 1) {
      pSVar1 = (SequenceDistanceGraph *)(pLVar5->node_view).id;
      pDVar7 = (pLVar5->node_view).dg;
      if ((pSVar1 != (SequenceDistanceGraph *)this->id) || (pDVar7 != this->dg)) {
        local_148._0_4_ = _S_red;
        local_148._8_8_ = (_Base_ptr)0x0;
        local_138 = (_Base_ptr)local_148;
        local_128 = 0;
        _Stack_108._0_8_ = _Stack_108._0_8_ & 0xffffffff00000000;
        _Stack_108._M_parent = (_Base_ptr)0x0;
        _Stack_108._M_left = &_Stack_108;
        local_e8 = 0;
        local_130 = local_138;
        local_120.id = (sgNodeID_t)pSVar1;
        local_120.dg = pDVar7;
        _Stack_108._M_right = _Stack_108._M_left;
        prev((vector<LinkView,_std::allocator<LinkView>_> *)&local_168,&local_120);
        pLVar3 = local_168._M_impl.super__Vector_impl_data._M_finish;
        for (pDVar7 = (DistanceGraph *)local_168._M_impl.super__Vector_impl_data._M_start;
            pDVar7 != (DistanceGraph *)pLVar3;
            pDVar7 = (DistanceGraph *)&(pDVar7->name)._M_string_length) {
          local_120.id = (sgNodeID_t)pDVar7->sdg;
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          _M_insert_unique<long>
                    ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                      *)&local_150,&local_120.id);
        }
        std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_168);
        local_120.id = (pLVar5->node_view).id;
        local_120.dg = (pLVar5->node_view).dg;
        next((vector<LinkView,_std::allocator<LinkView>_> *)&local_168,&local_120);
        pLVar3 = local_168._M_impl.super__Vector_impl_data._M_finish;
        for (pDVar7 = (DistanceGraph *)local_168._M_impl.super__Vector_impl_data._M_start;
            pDVar7 != (DistanceGraph *)pLVar3;
            pDVar7 = (DistanceGraph *)&(pDVar7->name)._M_string_length) {
          local_120.id = (sgNodeID_t)pDVar7->sdg;
          std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
          _M_insert_unique<long>
                    ((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                      *)local_110,&local_120.id);
        }
        std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_168);
        bVar4 = std::operator==(&local_60,
                                (_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                                 *)&local_150);
        if (bVar4) {
          bVar4 = std::operator==(&local_90,
                                  (_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                                   *)local_110);
          if (bVar4) {
            local_168._M_impl.super__Vector_impl_data._M_start = (pointer)(pLVar5->node_view).id;
            local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)(pLVar5->node_view).dg;
            std::vector<NodeView,_std::allocator<NodeView>_>::push_back
                      (__return_storage_ptr__,(value_type *)&local_168);
          }
        }
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                   *)local_110);
        std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
        ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                   *)&local_150);
        local_d8._M_impl.super__Vector_impl_data._M_finish = local_e0;
      }
    }
    std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_d8);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_90);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_60);
  }
  std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_c0);
  std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<NodeView> NodeView::parallels() const {
    auto p=prev(),n=next();
    if (p.empty() or n.empty()) return {};
    std::vector<NodeView> pars;
    std::set<sgNodeID_t> pnodes,nnodes;
    for (auto &plv:prev()) pnodes.insert(plv.node().node_id());
    for (auto &nlv:next()) nnodes.insert(nlv.node().node_id());
    for (auto &other:prev()[0].node().next()){
        if (other.node()==*this) continue;
        std::set<sgNodeID_t> opnodes,onnodes;
        for (auto &plv:other.node().prev()) opnodes.insert(plv.node().node_id());
        for (auto &nlv:other.node().next()) onnodes.insert(nlv.node().node_id());
        if (pnodes==opnodes and nnodes==onnodes) pars.push_back(other.node());
    }
    return pars;
}